

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdLib.cpp
# Opt level: O1

void __thiscall ObjectBlockPool<512,_128>::Mark(ObjectBlockPool<512,_128> *this,uint number)

{
  MyLargeBlock *pMVar1;
  Block *pBVar2;
  ulong uVar3;
  ulong uVar4;
  
  if (number < 2) {
    pMVar1 = this->activePages;
    if (pMVar1 != (MyLargeBlock *)0x0) {
      do {
        if ((pMVar1 != this->activePages) || (this->lastNum != 0)) {
          pBVar2 = pMVar1->page;
          uVar3 = 0;
          do {
            pBVar2->marker = pBVar2->marker & 0xfffffffffffffffe | (ulong)number;
            uVar3 = uVar3 + 1;
            uVar4 = (ulong)this->lastNum;
            if (pMVar1 != this->activePages) {
              uVar4 = 0x80;
            }
            pBVar2 = pBVar2 + 1;
          } while (uVar3 < uVar4);
        }
        pMVar1 = pMVar1->next;
      } while (pMVar1 != (LargeBlock<512,_128> *)0x0);
    }
    return;
  }
  __assert_fail("number <= 1",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/StdLib.cpp"
                ,0xe6,
                "void ObjectBlockPool<512, 128>::Mark(unsigned int) [elemSize = 512, countInBlock = 128]"
               );
}

Assistant:

void Mark(unsigned int number)
	{
		assert(number <= 1);
		MyLargeBlock *curr = activePages;
		while(curr)
		{
			for(unsigned int i = 0; i < (curr == activePages ? lastNum : countInBlock); i++)
			{
				curr->page[i].marker = (curr->page[i].marker & ~NULLC::OBJECT_VISIBLE) | number;
			}
			curr = curr->next;
		}
	}